

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::Options::checked_parse_arg
          (Options *this,int argc,char **argv,int *current,shared_ptr<cxxopts::OptionDetails> *value
          ,string *name)

{
  int *piVar1;
  element_type *peVar2;
  int iVar3;
  missing_argument_exception *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (*current + 1 < argc) {
    if (*argv[(long)*current + 1] == '-') {
      iVar3 = (*((((value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->m_value).
                 super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Value[4])();
      if ((char)iVar3 != '\0') {
        peVar4 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        p_Var5 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
        peVar2 = (peVar4->m_value).
                 super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**peVar2->_vptr_Value)(peVar2,local_40);
        goto LAB_001289cd;
      }
    }
    peVar4 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var5 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    std::__cxx11::string::string((string *)local_40,argv[(long)*current + 1],&local_41);
    peVar2 = (peVar4->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar2->_vptr_Value)(peVar2,local_40);
    piVar1 = &peVar4->m_count;
    *piVar1 = *piVar1 + 1;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    *current = *current + 1;
  }
  else {
    iVar3 = (*((((value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_value).
               super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Value[4])();
    if ((char)iVar3 == '\0') {
      this_00 = (missing_argument_exception *)__cxa_allocate_exception(0x28);
      missing_argument_exception::missing_argument_exception(this_00,name);
      __cxa_throw(this_00,&missing_argument_exception::typeinfo,OptionException::~OptionException);
    }
    peVar4 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var5 = (value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    peVar2 = (peVar4->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar2->_vptr_Value)(peVar2,local_40);
LAB_001289cd:
    peVar4->m_count = peVar4->m_count + 1;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  }
  return;
}

Assistant:

void
Options::checked_parse_arg
(
  int argc,
  char* argv[],
  int& current,
  std::shared_ptr<OptionDetails> value,
  const std::string& name
)
{
  if (current + 1 >= argc)
  {
    if (value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      throw missing_argument_exception(name);
    }
  }
  else
  {
    if (argv[current + 1][0] == '-' && value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      parse_option(value, name, argv[current + 1]);
      ++current;
    }
  }
}